

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

void __thiscall LZ77Compressor::next(LZ77Compressor *this,uint8_t *input,int *i,int maxLen,int end)

{
  pointer *ppIVar1;
  iterator iVar2;
  undefined3 uVar3;
  undefined1 uVar4;
  bool bVar5;
  int offset;
  int iVar6;
  int matchLen;
  int matchOff;
  Item local_38;
  int local_30;
  ushort local_2c [2];
  
  local_38.field_1.field_1.offset = 0;
  local_38._0_4_ = 0;
  bVar5 = search(this,input,*i,maxLen,(int *)local_2c,&local_30);
  uVar3 = local_38._1_3_;
  uVar4 = local_38.field_1._1_1_;
  if (bVar5) {
    local_38.isRepeat = true;
    local_38._0_4_ = CONCAT31(uVar3,local_38.isRepeat);
    local_38.field_1.value = (char)local_30 + -3;
    local_38._0_4_ = CONCAT13(uVar4,local_38._0_3_);
    local_38.field_1.field_1.offset = ~local_2c[0] + (short)*i;
    iVar2._M_current =
         (this->output).
         super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->output).
        super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<LZ77Compressor::Item,std::allocator<LZ77Compressor::Item>>::
      _M_realloc_insert<LZ77Compressor::Item_const&>
                ((vector<LZ77Compressor::Item,std::allocator<LZ77Compressor::Item>> *)&this->output,
                 iVar2,&local_38);
    }
    else {
      ((iVar2._M_current)->field_1).field_1.offset = local_38.field_1.field_1.offset;
      *(undefined4 *)iVar2._M_current = local_38._0_4_;
      ppIVar1 = &(this->output).
                 super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppIVar1 = *ppIVar1 + 1;
    }
    if (0 < local_30) {
      iVar6 = 0;
      do {
        offset = *i + iVar6;
        if (this->windowLength <= offset) {
          remove(this,(char *)input);
          offset = *i + iVar6;
        }
        if (offset < end) {
          add(this,input,offset);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < local_30);
    }
  }
  else {
    local_38._0_2_ = local_38._1_2_ << 8;
    local_38.field_1.value = input[*i];
    iVar2._M_current =
         (this->output).
         super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->output).
        super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<LZ77Compressor::Item,std::allocator<LZ77Compressor::Item>>::
      _M_realloc_insert<LZ77Compressor::Item_const&>
                ((vector<LZ77Compressor::Item,std::allocator<LZ77Compressor::Item>> *)&this->output,
                 iVar2,&local_38);
    }
    else {
      ((iVar2._M_current)->field_1).field_1.offset = local_38.field_1.field_1.offset;
      *(undefined4 *)iVar2._M_current = local_38._0_4_;
      ppIVar1 = &(this->output).
                 super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppIVar1 = *ppIVar1 + 1;
    }
    iVar6 = *i;
    if (this->windowLength <= iVar6) {
      remove(this,(char *)input);
      iVar6 = *i;
    }
    add(this,input,iVar6);
    local_30 = 1;
  }
  *i = *i + local_30;
  return;
}

Assistant:

void next(const uint8_t* input, int& i, int maxLen, int end) {
		int matchOff, matchLen;
		Item item = {0};
		if (search(input, i, maxLen, matchOff, matchLen)) {
			item.isRepeat = true;
			item.length = matchLen - 3;
			item.offset = (i - matchOff) - 1;
			output.push_back(item);
			for (int j = 0; j < matchLen; j++) {
				if (i + j >= windowLength) {
					remove(input, i + j - windowLength);
				}
				if (i + j < end) {
					add(input, i + j);
				}
			}
			i += matchLen;
		} else {
			item.isRepeat = false;
			item.value = input[i];
			output.push_back(item);
			if (i >= windowLength) {
				remove(input, i - windowLength);
			}
			add(input, i);
			i++;
		}
	}